

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.hpp
# Opt level: O3

unsigned_long mxx::left_shift<unsigned_long>(unsigned_long *t,comm *comm)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long right_value;
  MPI_Request recv_req;
  datatype dt;
  unsigned_long local_38;
  undefined1 local_30 [8];
  datatype local_28;
  
  local_28._vptr_datatype = (_func_int **)&PTR__datatype_00150928;
  local_28.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  local_28.builtin = true;
  local_38 = 0;
  iVar1 = comm->m_rank;
  if (iVar1 < comm->m_size + -1) {
    MPI_Irecv(&local_38,1,&ompi_mpi_unsigned_long,iVar1 + 1,0xf,comm->mpi_comm,local_30);
    iVar1 = comm->m_rank;
  }
  if (0 < iVar1) {
    MPI_Send(t,1,local_28.mpitype,iVar1 + -1,0xf,comm->mpi_comm);
    iVar1 = comm->m_rank;
  }
  if (iVar1 < comm->m_size + -1) {
    MPI_Wait(local_30,0);
  }
  uVar2 = local_38;
  datatype::~datatype(&local_28);
  return uVar2;
}

Assistant:

T left_shift(const T& t, const mxx::comm& comm = mxx::comm()) {
    // get datatype
    datatype dt = get_datatype<T>();

    // TODO: handle tags with MXX (get unique tag function)
    int tag = 15;

    T right_value = T();
    MPI_Request recv_req;
    // if not last processor
    if (comm.rank() < comm.size()-1) {
        MPI_Irecv(&right_value, 1, dt.type(), comm.rank()+1, tag,
                  comm, &recv_req);
    }
    // if not first processor
    if (comm.rank() > 0) {
        // send my most right element to the right
        MPI_Send(const_cast<T*>(&t), 1, dt.type(), comm.rank()-1, tag, comm);
    }
    if (comm.rank() < comm.size()-1) {
        // wait for the async receive to finish
        MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
    }
    return right_value;
}